

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

void __thiscall DImpactDecal::DImpactDecal(DImpactDecal *this,double z)

{
  DThinker::DThinker((DThinker *)this,2);
  (this->super_DBaseDecal).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00709da8;
  (this->super_DBaseDecal).WallNext = (DBaseDecal *)0x0;
  (this->super_DBaseDecal).WallPrev = (DBaseDecal *)0x0;
  (this->super_DBaseDecal).LeftDistance = 0.0;
  (this->super_DBaseDecal).Z = z;
  (this->super_DBaseDecal).ScaleX = 1.0;
  (this->super_DBaseDecal).ScaleY = 1.0;
  (this->super_DBaseDecal).Alpha = 1.0;
  (this->super_DBaseDecal).AlphaColor = 0;
  (this->super_DBaseDecal).Translation = 0;
  (this->super_DBaseDecal).RenderFlags = 0;
  (this->super_DBaseDecal).Side = (side_t *)0x0;
  (this->super_DBaseDecal).Sector = (sector_t_conflict *)0x0;
  (this->super_DBaseDecal).RenderStyle = LegacyRenderStyles[0];
  (this->super_DBaseDecal).PicNum.texnum = -1;
  (this->super_DBaseDecal).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00709e10;
  ImpactCount = ImpactCount + 1;
  return;
}

Assistant:

DImpactDecal::DImpactDecal (double z)
: DBaseDecal (STAT_AUTODECAL, z)
{
	ImpactCount++;
}